

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O2

Connection
QObjectPrivate::
connect<void(QAbstractItemModel::*)(Qt::Orientation,int,int),void(QAbstractItemViewPrivate::*)()>
          (Object *sender,offset_in_QAbstractItemModel_to_subr signal,Object *receiverPrivate,
          Function slot,ConnectionType type)

{
  void **ppvVar1;
  QMetaObject *pQVar2;
  undefined4 *puVar3;
  undefined4 in_register_00000084;
  uint in_R9D;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  QSlotObjectBase local_58;
  Object *local_48;
  Function local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = receiverPrivate;
  local_40 = slot;
  if ((in_R9D & 0xfffffffe) == 2) {
    pQVar2 = (QMetaObject *)
             QtPrivate::ConnectionTypes<QtPrivate::List<Qt::Orientation,_int,_int>,_true>::types();
  }
  else {
    pQVar2 = (QMetaObject *)0x0;
  }
  ppvVar1 = *(void ***)(CONCAT44(in_register_00000084,type) + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QAbstractItemViewPrivate::*)(),_QtPrivate::List<>,_void>
       ::impl;
  *(undefined8 *)(puVar3 + 4) = in_stack_00000008;
  *(undefined8 *)(puVar3 + 6) = in_stack_00000010;
  QObject::connectImpl
            ((QObject *)sender,(void **)signal,(QObject *)&local_48,ppvVar1,&local_58,
             (ConnectionType)puVar3,(int *)(ulong)in_R9D,pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Connection)sender;
  }
  __stack_chk_fail();
}

Assistant:

inline QMetaObject::Connection QObjectPrivate::connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                                       const typename QtPrivate::FunctionPointer<Func2>::Object *receiverPrivate, Func2 slot,
                                                       Qt::ConnectionType type)
{
    typedef QtPrivate::FunctionPointer<Func1> SignalType;
    typedef QtPrivate::FunctionPointer<Func2> SlotType;
    static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                      "No Q_OBJECT in the class with the signal");

    //compilation error if the arguments does not match.
    static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                      "The slot requires more arguments than the signal provides.");
    static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                      "Signal and slot arguments are not compatible.");
    static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                      "Return type of the slot is not compatible with the return type of the signal.");

    const int *types = nullptr;
    if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
        types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

    return QObject::connectImpl(sender, reinterpret_cast<void **>(&signal),
        QtPrivate::getQObject(receiverPrivate), reinterpret_cast<void **>(&slot),
        new QtPrivate::QPrivateSlotObject<Func2, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotType::ArgumentCount>::Value,
                                        typename SignalType::ReturnType>(slot),
        type, types, &SignalType::Object::staticMetaObject);
}